

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_host.c
# Opt level: O2

void dfft_redistribute_block_to_cyclic_1d
               (int *dim,int *pdim,int ndim,int current_dim,int c0,int c1,int *pidx,int size_in,
               int *embed,cpx_t *work,cpx_t *scratch,int *dfft_nsend,int *dfft_nrecv,
               int *dfft_offset_send,int *dfft_offset_recv,MPI_Comm comm,int *proc_map,int row_m)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  cpx_t *pcVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  cpx_t *pcVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  cpx_t *local_80;
  int local_70;
  cpx_t *local_50;
  
  if (c0 != c1) {
    uVar15 = (long)dim[current_dim] / (long)pdim[current_dim] & 0xffffffff;
    iVar14 = embed[current_dim];
    iVar1 = pidx[current_dim];
    iVar18 = (int)((long)dim[current_dim] / (long)pdim[current_dim]);
    uVar3 = (uint)((long)((ulong)(uint)(iVar18 >> 0x1f) << 0x20 | uVar15) / (long)(c1 / c0));
    uVar17 = 1;
    if ((int)uVar3 < 2) {
      uVar3 = 1;
    }
    uVar15 = (long)((ulong)(uint)(iVar18 >> 0x1f) << 0x20 | uVar15) / (long)(int)uVar3;
    uVar10 = 0;
    uVar20 = 0;
    if (0 < ndim) {
      uVar20 = (ulong)(uint)ndim;
    }
    for (; uVar20 != uVar10; uVar10 = uVar10 + 1) {
      uVar17 = uVar17 * pdim[uVar10];
    }
    uVar11 = 0;
    uVar10 = (ulong)uVar17;
    if ((int)uVar17 < 1) {
      uVar10 = uVar11;
    }
    for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
      dfft_nsend[uVar11] = 0;
      dfft_nrecv[uVar11] = 0;
      dfft_offset_send[uVar11] = 0;
      dfft_offset_recv[uVar11] = 0;
    }
    iVar4 = (int)((long)size_in / (long)iVar14);
    iVar13 = uVar3 * iVar4;
    uVar19 = (ulong)(uint)current_dim;
    uVar10 = 0;
    uVar11 = 0;
    if (0 < iVar4) {
      uVar11 = (long)size_in / (long)iVar14 & 0xffffffff;
    }
    lVar9 = (long)iVar4;
    uVar7 = uVar15 & 0xffffffff;
    if ((int)uVar15 < 1) {
      uVar7 = uVar10;
    }
    local_80 = scratch;
    local_50 = work;
    for (; uVar10 != uVar7; uVar10 = uVar10 + 1) {
      iVar14 = (int)uVar10 * c0 + (iVar1 - iVar1 % c0) * iVar18 + iVar1 % c0;
      iVar14 = iVar14 % c1 + (iVar14 / (iVar18 * c1)) * c1;
      if (row_m == 0) {
        iVar5 = 0;
        for (uVar15 = 0; uVar20 != uVar15; uVar15 = uVar15 + 1) {
          iVar6 = iVar14;
          if (uVar19 != uVar15) {
            iVar6 = pidx[uVar15];
          }
          iVar5 = iVar5 * pdim[uVar15] + iVar6;
        }
      }
      else {
        iVar5 = 0;
        for (uVar15 = (ulong)(uint)ndim; 0 < (int)uVar15; uVar15 = uVar15 - 1) {
          iVar6 = iVar14;
          if (uVar19 + 1 != uVar15) {
            iVar6 = pidx[uVar15 - 1];
          }
          iVar5 = iVar5 * pdim[uVar15 - 1] + iVar6;
        }
      }
      iVar14 = proc_map[iVar5];
      dfft_nsend[iVar14] = iVar13 * 8;
      dfft_offset_send[iVar14] = (int)uVar10 * iVar13 * 8;
      pcVar8 = local_80;
      pcVar12 = local_50;
      for (uVar15 = 0; uVar15 != uVar3; uVar15 = uVar15 + 1) {
        for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
          pcVar8[uVar16] = pcVar12[uVar16];
        }
        pcVar12 = pcVar12 + (c1 / c0) * lVar9;
        pcVar8 = pcVar8 + lVar9;
      }
      local_50 = local_50 + lVar9;
      local_80 = local_80 + iVar13;
    }
    for (iVar14 = 0; local_70 = (int)uVar7, iVar14 != local_70; iVar14 = iVar14 + 1) {
      iVar5 = ((iVar14 * iVar13) / iVar4) * c1 + (iVar1 - iVar1 % c1) * iVar18 + iVar1 % c1;
      iVar5 = iVar5 % c0 + (iVar5 / (iVar18 * c0)) * c0;
      if (row_m == 0) {
        iVar6 = 0;
        for (uVar15 = 0; uVar20 != uVar15; uVar15 = uVar15 + 1) {
          iVar2 = iVar5;
          if (uVar19 != uVar15) {
            iVar2 = pidx[uVar15];
          }
          iVar6 = iVar6 * pdim[uVar15] + iVar2;
        }
      }
      else {
        iVar6 = 0;
        for (uVar15 = (ulong)(uint)ndim; 0 < (int)uVar15; uVar15 = uVar15 - 1) {
          iVar2 = iVar5;
          if (uVar19 + 1 != uVar15) {
            iVar2 = pidx[uVar15 - 1];
          }
          iVar6 = iVar6 * pdim[uVar15 - 1] + iVar2;
        }
      }
      iVar5 = proc_map[iVar6];
      dfft_nrecv[iVar5] = iVar13 * 8;
      dfft_offset_recv[iVar5] = iVar14 * iVar13 * 8;
    }
    MPI_Barrier(comm);
    MPI_Alltoallv(scratch,dfft_nsend,dfft_offset_send,&ompi_mpi_byte,work,dfft_nrecv,
                  dfft_offset_recv,&ompi_mpi_byte,comm);
  }
  return;
}

Assistant:

void dfft_redistribute_block_to_cyclic_1d(
                  int *dim,
                  int *pdim,
                  int ndim,
                  int current_dim,
                  int c0,
                  int c1,
                  int* pidx,
                  int size_in,
                  int *embed,
                  cpx_t *work,
                  cpx_t *scratch,
                  int *dfft_nsend,
                  int *dfft_nrecv,
                  int *dfft_offset_send,
                  int *dfft_offset_recv,
                  MPI_Comm comm,
                  int *proc_map,
                  int row_m)
    {
    /* exit early if nothing needs to be done */
    if (c0 == c1) return;

    int length = dim[current_dim]/pdim[current_dim];

    /* compute stride for column major matrix storage */
    int stride = size_in/embed[current_dim];

    /* processor index along current dimension */
    int s = pidx[current_dim];
    int p = pdim[current_dim];

    int ratio = c1/c0;
    int size = ((length/ratio > 1) ? (length/ratio) : 1);
    int npackets = length/size;
    size *= stride;

    int pdim_tot=1;
    int k;
    for (k = 0; k < ndim; ++k)
        pdim_tot *= pdim[k];

    int t;
    for (t = 0; t<pdim_tot; ++t)
        {
        dfft_nsend[t] = 0;
        dfft_nrecv[t] = 0;
        dfft_offset_send[t] = 0;
        dfft_offset_recv[t] = 0;
        }

    int j0;
    int j2;

    j0 = s % c0;
    j2 = s / c0;

    /* initialize send offsets and pack data */
    int j;
    #pragma omp parallel for private(j,k)
    for (j = 0; j < npackets; ++j)
        {
        int offset = j*size;
        int jglob = j2*c0*length + j * c0 + j0;
        int desti = (jglob/(c1*length))*c1+ jglob%c1;
        int destproc = 0;
        if (row_m)
            {
            for (k = ndim-1; k >=0 ;--k)
                {
                destproc *= pdim[k];
                destproc += ((current_dim == k) ? desti : pidx[k]);
                }
            }
        else
            {
            for (k = 0; k < ndim; ++k)
                {
                destproc *= pdim[k];
                destproc += ((current_dim == k) ? desti : pidx[k]);
                }
            }

        int rank = proc_map[destproc];
        dfft_nsend[rank] = size*sizeof(cpx_t);
        dfft_offset_send[rank] = offset*sizeof(cpx_t);
        int r;
        for(r=0; r< (size/stride); r++)
            for (k=0; k < stride; k++)
               scratch[offset + r*stride+k]=  work[(j+r*ratio)*stride+k];
        }

    /* initialize recv offsets */
    int offset = 0;
    j0 = s % c1;
    j2 = s/c1;

    int r;
    for (r = 0; r < npackets; ++r)
        {
        offset = r*size;
        j = r*size/stride;
        int jglob = j2*c1*length+ j * c1 + j0;
        int srci = (jglob/(c0*length))*c0+jglob%c0;
        int srcproc = 0;
        int k;
        if (row_m)
            {
            for (k = ndim-1; k >= 0; --k)
                {
                srcproc *= pdim[k];
                srcproc += ((current_dim == k) ? srci : pidx[k]);
                }
            }
        else
            {
            for (k = 0; k < ndim; ++k)
                {
                srcproc *= pdim[k];
                srcproc += ((current_dim == k) ? srci : pidx[k]);
                }
            }

        int rank = proc_map[srcproc];

        dfft_nrecv[rank] = size*sizeof(cpx_t);
        dfft_offset_recv[rank] = offset*sizeof(cpx_t);
        }

    /* synchronize */
    MPI_Barrier(comm);

    /* communicate */
    MPI_Alltoallv(scratch,dfft_nsend, dfft_offset_send, MPI_BYTE,
                  work, dfft_nrecv, dfft_offset_recv, MPI_BYTE,
                  comm);
    }